

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

ON_Material * __thiscall
ON_RenderMaterial::ToOnMaterial(ON_Material *__return_storage_ptr__,ON_RenderMaterial *this)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar5;
  ON_XMLNode *node;
  wchar_t *pwVar6;
  long lVar7;
  ON_XMLVariant *pOVar8;
  ON_Xform *pOVar9;
  byte bVar10;
  double dVar11;
  ON_4fColor OVar12;
  ON_XMLParameters p;
  ON_wString s;
  BRDFs brdf;
  ON_Texture tex;
  shared_ptr<ON_PhysicallyBasedMaterial> pbm;
  ON_XMLParameters local_3d8;
  undefined1 local_3c8 [24];
  ON_Texture local_3b0;
  ON_ClassArray<ON_Texture> *local_1b0;
  undefined1 local_1a8 [248];
  ON_4fColor local_b0;
  
  bVar10 = 0;
  local_3c8._16_8_ = &((this->super_ON_RenderContent)._private)->m_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)local_3c8._16_8_);
  if (iVar4 == 0) {
    ON_Material::ON_Material(__return_storage_ptr__);
    node = ON_XMLNode::GetNamedChild
                     (&((this->super_ON_RenderContent)._private)->m_node,L"simulation");
    if (node != (ON_XMLNode *)0x0) {
      ON_XMLParameters::ON_XMLParameters(&local_3d8,node);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"ambient");
      local_1a8._0_16_ = (undefined1  [16])::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
      aVar5 = (anon_union_4_2_6147a14e_for_ON_Color_15)
              ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_1a8);
      (__return_storage_ptr__->m_ambient).field_0 = aVar5;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"diffuse");
      local_1a8._0_16_ = (undefined1  [16])::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
      aVar5 = (anon_union_4_2_6147a14e_for_ON_Color_15)
              ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_1a8);
      (__return_storage_ptr__->m_diffuse).field_0 = aVar5;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"emission");
      local_1a8._0_16_ = (undefined1  [16])::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
      aVar5 = (anon_union_4_2_6147a14e_for_ON_Color_15)
              ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_1a8);
      (__return_storage_ptr__->m_emission).field_0 = aVar5;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"specular");
      local_1a8._0_16_ = (undefined1  [16])::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
      aVar5 = (anon_union_4_2_6147a14e_for_ON_Color_15)
              ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_1a8);
      (__return_storage_ptr__->m_specular).field_0 = aVar5;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"shine");
      dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_shine = dVar11 * 255.0;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"reflection");
      local_1a8._0_16_ = (undefined1  [16])::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
      aVar5 = (anon_union_4_2_6147a14e_for_ON_Color_15)
              ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_1a8);
      (__return_storage_ptr__->m_reflection).field_0 = aVar5;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"reflectivity");
      dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_reflectivity = dVar11;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"transparency");
      dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_transparency = dVar11;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"transparent");
      local_1a8._0_16_ = (undefined1  [16])::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
      aVar5 = (anon_union_4_2_6147a14e_for_ON_Color_15)
              ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_1a8);
      (__return_storage_ptr__->m_transparent).field_0 = aVar5;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"ior");
      dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_index_of_refraction = dVar11;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"polish-amount");
      dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_reflection_glossiness = 1.0 - dVar11;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"clarity-amount");
      dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_refraction_glossiness = 1.0 - dVar11;
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"fresnel-enabled");
      bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&local_3b0);
      ON_Material::SetFresnelReflections(__return_storage_ptr__,bVar2);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"disable-lighting");
      bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&local_3b0);
      ON_Material::SetDisableLighting(__return_storage_ptr__,bVar2);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      __return_storage_ptr__->m_fresnel_index_of_refraction = 1.56;
      ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"is-physically-based");
      bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&local_3b0);
      ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
      if (bVar2) {
        ON_Material::ToPhysicallyBased(__return_storage_ptr__);
        ON_Material::PhysicallyBased((ON_Material *)local_1a8);
        local_3c8._12_4_ = 0;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-brdf");
        ::ON_XMLVariant::AsString((ON_XMLVariant *)local_3c8);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        bVar2 = ::operator==((ON_wString *)local_3c8,L"ward");
        if (bVar2) {
          local_3c8._12_4_ = 1;
        }
        (**(code **)(*(_func_int **)local_1a8._0_8_ + 0x20))(local_1a8._0_8_,local_3c8 + 0xc);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-base-color");
        local_b0 = ::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x30))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-subsurface");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x40))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-subsurface-scattering-color");
        local_b0 = ::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x50))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-subsurface-scattering-radius");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x60))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-specular");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x80))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-specular-tint");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0xa0))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-metallic");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x70))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-roughness");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0xb0))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-anisotropic");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0xc0))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-anisotropic-rotation");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0xd0))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-sheen");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0xe0))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-sheen-tint");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0xf0))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-clearcoat");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x100))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-clearcoat-roughness");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x110))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-opacity");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x130))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-opacity-ior");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x120))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-opacity-roughness");
        ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x140))(uVar1);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-emission");
        OVar12 = ::ON_XMLVariant::AsColor((ON_XMLVariant *)&local_3b0);
        (**(code **)(*(_func_int **)uVar1 + 0x150))(OVar12.m_color._0_8_,OVar12.m_color._8_8_,uVar1)
        ;
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-alpha");
        dVar11 = ::ON_XMLVariant::AsDouble((ON_XMLVariant *)&local_3b0);
        ON_PhysicallyBasedMaterial::SetAlpha((ON_PhysicallyBasedMaterial *)uVar1,dVar11);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        uVar1 = local_1a8._0_8_;
        ParamHelper((ON_XMLVariant *)&local_3b0,&local_3d8,L"pbr-use-base-color-texture-alpha");
        bVar2 = ::ON_XMLVariant::AsBool((ON_XMLVariant *)&local_3b0);
        ON_PhysicallyBasedMaterial::SetUseBaseColorTextureAlphaForObjectAlphaTransparencyTexture
                  ((ON_PhysicallyBasedMaterial *)uVar1,bVar2);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&local_3b0);
        ON_wString::~ON_wString((ON_wString *)local_3c8);
        if ((ON_UserData *)local_1a8._8_8_ != (ON_UserData *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
        }
      }
      ON_ModelComponent::Name((ON_ModelComponent *)&local_3b0);
      pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_3b0);
      ON_ModelComponent::SetName(&__return_storage_ptr__->super_ON_ModelComponent,pwVar6);
      ON_wString::~ON_wString((ON_wString *)&local_3b0);
      local_1b0 = &(__return_storage_ptr__->m_textures).super_ON_ClassArray<ON_Texture>;
      ON_ClassArray<ON_Texture>::SetCapacity(local_1b0,0);
      local_3c8._8_4_ = 1;
      do {
        ON_Texture::ON_Texture(&local_3b0);
        ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)local_1a8);
        ON_wString::ON_wString((ON_wString *)local_3c8);
        ON_wString::Format((ON_wString *)local_3c8,L"Texture-%u-",(ulong)(uint)local_3c8._8_4_);
        ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
        pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
        bVar2 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
        ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
        if (bVar2) {
          ::ON_XMLVariant::AsString((ON_XMLVariant *)&stack0xffffffffffffff50);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          ON_FileReference::SetFullPath(&local_3b0.m_image_file_reference,pwVar6,false);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_bOn = ::ON_XMLVariant::operator_cast_to_bool((ON_XMLVariant *)local_1a8);
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_blend_constant_A =
                 ::ON_XMLVariant::operator_cast_to_double((ON_XMLVariant *)local_1a8);
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_type = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)local_1a8);
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_minfilter = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)local_1a8);
            local_3b0.m_magfilter = local_3b0.m_minfilter;
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_mode = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)local_1a8);
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            ::ON_XMLVariant::AsXform
                      ((ON_Xform *)&stack0xffffffffffffff50,(ON_XMLVariant *)local_1a8);
            pOVar8 = (ON_XMLVariant *)&stack0xffffffffffffff50;
            pOVar9 = &local_3b0.m_uvw;
            for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
              pOVar9->m_xform[0][0] = (double)pOVar8->_vptr_ON_XMLVariant;
              pOVar8 = (ON_XMLVariant *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
              pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar10 * -2 + 1) * 8);
            }
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_wrapu = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)local_1a8);
          }
          ON_wString::operator+((ON_wString *)&stack0xffffffffffffff50,(wchar_t *)local_3c8);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
          bVar3 = ON_XMLParameters::GetParam(&local_3d8,pwVar6,(ON_XMLVariant *)local_1a8);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
          if (bVar3) {
            local_3b0.m_wrapv = ::ON_XMLVariant::AsInteger((ON_XMLVariant *)local_1a8);
          }
          ON_ClassArray<ON_Texture>::Append(local_1b0,&local_3b0);
          local_3c8._8_4_ = local_3c8._8_4_ + 1;
        }
        ON_wString::~ON_wString((ON_wString *)local_3c8);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)local_1a8);
        ON_Texture::~ON_Texture(&local_3b0);
      } while (bVar2);
      ON_XMLParameters::~ON_XMLParameters(&local_3d8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)local_3c8._16_8_);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

ON_Material ON_RenderMaterial::ToOnMaterial(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_Material mat;

  const ON_XMLNode* sim_node = _private->XMLNode_Simulation();
  if (nullptr != sim_node)
  {
    ON_XMLParameters p(*sim_node);

    mat.m_ambient               =       ParamHelper(p, ON_MATERIAL_AMBIENT              ).AsColor();
    mat.m_diffuse               =       ParamHelper(p, ON_MATERIAL_DIFFUSE              ).AsColor();
    mat.m_emission              =       ParamHelper(p, ON_MATERIAL_EMISSION             ).AsColor();
    mat.m_specular              =       ParamHelper(p, ON_MATERIAL_SPECULAR             ).AsColor();
    mat.m_shine                 =       ParamHelper(p, ON_MATERIAL_SHINE                ).AsDouble() * ON_Material::MaxShine;
    mat.m_reflection            =       ParamHelper(p, ON_MATERIAL_SIM_REFLECTION_COLOR ).AsColor();
    mat.m_reflectivity          =       ParamHelper(p, ON_MATERIAL_REFLECTIVITY_AMOUNT  ).AsDouble();
    mat.m_transparency          =       ParamHelper(p, ON_MATERIAL_TRANSPARENCY_AMOUNT  ).AsDouble();
    mat.m_transparent           =       ParamHelper(p, ON_MATERIAL_SIM_TRANSPARENT_COLOR).AsColor();
    mat.m_index_of_refraction   =       ParamHelper(p, ON_MATERIAL_IOR                  ).AsDouble();
    mat.m_reflection_glossiness = 1.0 - ParamHelper(p, ON_MATERIAL_POLISH_AMOUNT        ).AsDouble();
    mat.m_refraction_glossiness = 1.0 - ParamHelper(p, ON_MATERIAL_CLARITY_AMOUNT       ).AsDouble();
    mat.SetFresnelReflections   (       ParamHelper(p, ON_MATERIAL_FRESNEL_ENABLED      ).AsBool());
    mat.SetDisableLighting      (       ParamHelper(p, ON_MATERIAL_DISABLE_LIGHTING     ).AsBool());

    mat.m_fresnel_index_of_refraction = 1.56;

    if (ParamHelper(p, ON_MATERIAL_IS_PHYSICALLY_BASED).AsBool())
    {
      mat.ToPhysicallyBased();

      auto pbm = mat.PhysicallyBased();

      auto brdf = ON_PhysicallyBasedMaterial::BRDFs::GGX;
      const ON_wString s = ParamHelper(p, ON_PBR_MATERIAL_BRDF).AsString();
      if (s == ON_PBR_MATERIAL_BRDF_WARD)
        brdf = ON_PhysicallyBasedMaterial::BRDFs::Ward;
      pbm->SetBRDF(brdf);

      pbm->SetBaseColor                 (ParamHelper(p, ON_PBR_MATERIAL_BASE_COLOR).AsColor());
      pbm->SetSubsurface                (ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE).AsDouble());
      pbm->SetSubsurfaceScatteringColor (ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE_SCATTERING_COLOR).AsColor());
      pbm->SetSubsurfaceScatteringRadius(ParamHelper(p, ON_PBR_MATERIAL_SUBSURFACE_SCATTERING_RADIUS).AsDouble());
      pbm->SetSpecular                  (ParamHelper(p, ON_PBR_MATERIAL_SPECULAR).AsDouble());
      pbm->SetSpecularTint              (ParamHelper(p, ON_PBR_MATERIAL_SPECULAR_TINT).AsDouble());
      pbm->SetMetallic                  (ParamHelper(p, ON_PBR_MATERIAL_METALLIC).AsDouble());
      pbm->SetRoughness                 (ParamHelper(p, ON_PBR_MATERIAL_ROUGHNESS).AsDouble());
      pbm->SetAnisotropic               (ParamHelper(p, ON_PBR_MATERIAL_ANISOTROPIC).AsDouble());
      pbm->SetAnisotropicRotation       (ParamHelper(p, ON_PBR_MATERIAL_ANISOTROPIC_ROTATION).AsDouble());
      pbm->SetSheen                     (ParamHelper(p, ON_PBR_MATERIAL_SHEEN).AsDouble());
      pbm->SetSheenTint                 (ParamHelper(p, ON_PBR_MATERIAL_SHEEN_TINT).AsDouble());
      pbm->SetClearcoat                 (ParamHelper(p, ON_PBR_MATERIAL_CLEARCOAT).AsDouble());
      pbm->SetClearcoatRoughness        (ParamHelper(p, ON_PBR_MATERIAL_CLEARCOAT_ROUGHNESS).AsDouble());
      pbm->SetOpacity                   (ParamHelper(p, ON_PBR_MATERIAL_OPACITY).AsDouble());
      pbm->SetOpacityIOR                (ParamHelper(p, ON_PBR_MATERIAL_OPACITY_IOR).AsDouble());
      pbm->SetOpacityRoughness          (ParamHelper(p, ON_PBR_MATERIAL_OPACITY_ROUGHNESS).AsDouble());
      pbm->SetEmission                  (ParamHelper(p, ON_PBR_MATERIAL_EMISSION_COLOR).AsColor());
      pbm->SetAlpha                     (ParamHelper(p, ON_PBR_MATERIAL_ALPHA).AsDouble());
      pbm->SetUseBaseColorTextureAlphaForObjectAlphaTransparencyTexture(ParamHelper(p, ON_PBR_MATERIAL_USE_BASE_COLOR_TEXTURE_ALPHA).AsBool());
    }

    mat.SetName(Name());

    mat.m_textures.Destroy();

    // Iterate over the children.
    int count = 1;
    while (true)
    {
      ON_Texture tex;
      ON_XMLVariant v;

      ON_wString s;
      s.Format(ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FORMAT, count);

      if (!p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FILENAME, v))
        break; // Not ideal.

      tex.m_image_file_reference.SetFullPath(v.AsString(), false);

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_ON, v))
        tex.m_bOn = v;

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_AMOUNT, v))
        tex.m_blend_constant_A = v;

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_TYPE, v))
        tex.m_type = ON_Texture::TYPE(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_FILTER, v))
        tex.m_minfilter = tex.m_magfilter = ON_Texture::FILTER(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_MODE, v))
        tex.m_mode = ON_Texture::MODE(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_UVW, v))
        tex.m_uvw = v.AsXform();

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_WRAP_U, v))
        tex.m_wrapu = ON_Texture::WRAP(v.AsInteger());

      if (p.GetParam(s + ON_RENDER_MATERIAL_TEXTURE_SIMULATION_WRAP_V, v))
        tex.m_wrapv = ON_Texture::WRAP(v.AsInteger());

      mat.m_textures.Append(tex);
      count++;
    }
  }

  return mat;
}